

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::session_impl::preemptive_unchoke(session_impl *this)

{
  int iVar1;
  session_settings *this_00;
  int64_t iVar2;
  int64_t iVar3;
  bool local_21;
  session_impl *this_local;
  
  this_00 = settings(this);
  iVar1 = session_settings::get_int(this_00,0x401f);
  if (iVar1 == 0) {
    iVar2 = counters::operator[](&this->m_stats_counters,0xeb);
    iVar3 = counters::operator[](&this->m_stats_counters,0xfd);
    local_21 = true;
    if (iVar3 <= iVar2) {
      iVar1 = session_settings::get_int(&this->m_settings,0x4053);
      local_21 = iVar1 < 0;
    }
    this_local._7_1_ = local_21;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool session_impl::preemptive_unchoke() const
	{
		if (settings().get_int(settings_pack::choking_algorithm) != settings_pack::fixed_slots_choker) return false;
		return m_stats_counters[counters::num_peers_up_unchoked]
			< m_stats_counters[counters::num_unchoke_slots]
			|| m_settings.get_int(settings_pack::unchoke_slots_limit) < 0;
	}